

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

int uv_timer_init(uv_loop_t *loop,uv_timer_t *handle)

{
  uv__queue *puVar1;
  
  handle->loop = loop;
  handle->type = UV_TIMER;
  handle->flags = 8;
  (handle->handle_queue).next = &loop->handle_queue;
  puVar1 = (loop->handle_queue).prev;
  (handle->handle_queue).prev = puVar1;
  puVar1->next = &handle->handle_queue;
  (loop->handle_queue).prev = &handle->handle_queue;
  handle->next_closing = (uv_handle_t *)0x0;
  handle->timer_cb = (uv_timer_cb)0x0;
  handle->timeout = 0;
  handle->repeat = 0;
  (handle->node).heap[0] = &handle->node;
  (handle->node).heap[1] = &handle->node;
  return 0;
}

Assistant:

int uv_timer_init(uv_loop_t* loop, uv_timer_t* handle) {
  uv__handle_init(loop, (uv_handle_t*)handle, UV_TIMER);
  handle->timer_cb = NULL;
  handle->timeout = 0;
  handle->repeat = 0;
  uv__queue_init(&handle->node.queue);
  return 0;
}